

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O3

int __thiscall simple_thread_pool::ThreadHandle::shutdown(ThreadHandle *this,int __fd,int __how)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int extraout_EAX;
  int iVar3;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  
  EventAwaiter::invoke(&this->eaLoop);
  peVar1 = (this->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar3 = extraout_EAX;
  if ((peVar1 != (element_type *)0x0) && ((peVar1->_M_id)._M_thread != 0)) {
    iVar3 = std::thread::join();
  }
  p_Var2 = (this->myself).
           super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->myself).super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->myself).super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    iVar3 = extraout_EAX_00;
  }
  p_Var2 = (this->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->tHandle).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    iVar3 = extraout_EAX_01;
  }
  p_Var2 = (this->assignedTask).
           super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->assignedTask).
  super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->assignedTask).
  super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return extraout_EAX_02;
  }
  return iVar3;
}

Assistant:

void shutdown() {
        eaLoop.invoke();
        if (tHandle && tHandle->joinable()) {
            tHandle->join();
        }
        myself.reset();
        tHandle.reset();
        assignedTask.reset();
    }